

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.cpp
# Opt level: O0

void __thiscall cppcms::encoding::impl::validators_set::validators_set(validators_set *this)

{
  mapped_type p_Var1;
  mapped_type *pp_Var2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
  *this_00;
  encoding_tester_type iso_tester;
  key_type *in_stack_fffffffffffff678;
  key_type *__k;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
  *in_stack_fffffffffffff680;
  allocator local_5e1;
  string local_5e0 [39];
  allocator local_5b9;
  string local_5b8 [39];
  undefined1 local_591 [40];
  allocator local_569;
  string local_568 [39];
  allocator local_541;
  string local_540 [39];
  allocator local_519;
  string local_518 [39];
  allocator local_4f1;
  string local_4f0 [39];
  allocator local_4c9;
  string local_4c8 [39];
  allocator local_4a1;
  string local_4a0 [39];
  allocator local_479;
  string local_478 [39];
  allocator local_451;
  string local_450 [39];
  allocator local_429;
  string local_428 [39];
  allocator local_401;
  string local_400 [39];
  allocator local_3d9;
  string local_3d8 [39];
  allocator local_3b1;
  string local_3b0 [39];
  allocator local_389;
  string local_388 [39];
  allocator local_361;
  string local_360 [39];
  allocator local_339;
  string local_338 [39];
  allocator local_311;
  string local_310 [39];
  allocator local_2e9;
  string local_2e8 [39];
  allocator local_2c1;
  string local_2c0 [39];
  allocator local_299;
  string local_298 [39];
  allocator local_271;
  string local_270 [39];
  allocator local_249;
  string local_248 [39];
  allocator local_221;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [39];
  allocator local_1d1;
  string local_1d0 [39];
  allocator local_1a9;
  string local_1a8 [39];
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [39];
  allocator local_131;
  string local_130 [39];
  allocator local_109;
  string local_108 [39];
  allocator local_e1;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  mapped_type local_10;
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
         *)0x3f049a);
  local_10 = iso_8859_1_2_4_5_9_10_13_14_15_16_valid<char_const*>;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"latin1",&local_31);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](in_stack_fffffffffffff680,in_stack_fffffffffffff678);
  *pp_Var2 = iso_8859_1_2_4_5_9_10_13_14_15_16_valid<char_const*>;
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  p_Var1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"iso88591",&local_69);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](in_stack_fffffffffffff680,in_stack_fffffffffffff678);
  *pp_Var2 = p_Var1;
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  p_Var1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"iso88592",&local_91);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](in_stack_fffffffffffff680,in_stack_fffffffffffff678);
  *pp_Var2 = p_Var1;
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  p_Var1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"iso88594",&local_b9);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](in_stack_fffffffffffff680,in_stack_fffffffffffff678);
  *pp_Var2 = p_Var1;
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  p_Var1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"iso88595",&local_e1);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](in_stack_fffffffffffff680,in_stack_fffffffffffff678);
  *pp_Var2 = p_Var1;
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  p_Var1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"iso88599",&local_109);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](in_stack_fffffffffffff680,in_stack_fffffffffffff678);
  *pp_Var2 = p_Var1;
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  p_Var1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"iso885910",&local_131);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](in_stack_fffffffffffff680,in_stack_fffffffffffff678);
  *pp_Var2 = p_Var1;
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  p_Var1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"iso885913",&local_159);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](in_stack_fffffffffffff680,in_stack_fffffffffffff678);
  *pp_Var2 = p_Var1;
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  p_Var1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"iso885914",&local_181);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](in_stack_fffffffffffff680,in_stack_fffffffffffff678);
  *pp_Var2 = p_Var1;
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  p_Var1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a8,"iso885915",&local_1a9);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](in_stack_fffffffffffff680,in_stack_fffffffffffff678);
  *pp_Var2 = p_Var1;
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  p_Var1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d0,"iso885916",&local_1d1);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](in_stack_fffffffffffff680,in_stack_fffffffffffff678);
  *pp_Var2 = p_Var1;
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"iso88593",&local_1f9);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](in_stack_fffffffffffff680,in_stack_fffffffffffff678);
  *pp_Var2 = iso_8859_3_valid<char_const*>;
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_220,"iso88596",&local_221);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](in_stack_fffffffffffff680,in_stack_fffffffffffff678);
  *pp_Var2 = iso_8859_6_valid<char_const*>;
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_248,"iso88597",&local_249);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](in_stack_fffffffffffff680,in_stack_fffffffffffff678);
  *pp_Var2 = iso_8859_7_valid<char_const*>;
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_270,"iso88598",&local_271);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](in_stack_fffffffffffff680,in_stack_fffffffffffff678);
  *pp_Var2 = iso_8859_8_valid<char_const*>;
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_298,"iso885911",&local_299);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](in_stack_fffffffffffff680,in_stack_fffffffffffff678);
  *pp_Var2 = iso_8859_11_valid<char_const*>;
  std::__cxx11::string::~string(local_298);
  std::allocator<char>::~allocator((allocator<char> *)&local_299);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c0,"windows1250",&local_2c1);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](in_stack_fffffffffffff680,in_stack_fffffffffffff678);
  *pp_Var2 = windows_1250_valid<char_const*>;
  std::__cxx11::string::~string(local_2c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2e8,"windows1251",&local_2e9);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](in_stack_fffffffffffff680,in_stack_fffffffffffff678);
  *pp_Var2 = windows_1251_valid<char_const*>;
  std::__cxx11::string::~string(local_2e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_310,"windows1252",&local_311);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](in_stack_fffffffffffff680,in_stack_fffffffffffff678);
  *pp_Var2 = windows_1252_valid<char_const*>;
  std::__cxx11::string::~string(local_310);
  std::allocator<char>::~allocator((allocator<char> *)&local_311);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_338,"windows1253",&local_339);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](in_stack_fffffffffffff680,in_stack_fffffffffffff678);
  *pp_Var2 = windows_1253_valid<char_const*>;
  std::__cxx11::string::~string(local_338);
  std::allocator<char>::~allocator((allocator<char> *)&local_339);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_360,"windows1255",&local_361);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](in_stack_fffffffffffff680,in_stack_fffffffffffff678);
  *pp_Var2 = windows_1255_valid<char_const*>;
  std::__cxx11::string::~string(local_360);
  std::allocator<char>::~allocator((allocator<char> *)&local_361);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_388,"windows1256",&local_389);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](in_stack_fffffffffffff680,in_stack_fffffffffffff678);
  *pp_Var2 = windows_1256_valid<char_const*>;
  std::__cxx11::string::~string(local_388);
  std::allocator<char>::~allocator((allocator<char> *)&local_389);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b0,"windows1257",&local_3b1);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](in_stack_fffffffffffff680,in_stack_fffffffffffff678);
  *pp_Var2 = windows_1257_valid<char_const*>;
  std::__cxx11::string::~string(local_3b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3d8,"windows1258",&local_3d9);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](in_stack_fffffffffffff680,in_stack_fffffffffffff678);
  *pp_Var2 = windows_1258_valid<char_const*>;
  std::__cxx11::string::~string(local_3d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_400,"cp1250",&local_401);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](in_stack_fffffffffffff680,in_stack_fffffffffffff678);
  *pp_Var2 = windows_1250_valid<char_const*>;
  std::__cxx11::string::~string(local_400);
  std::allocator<char>::~allocator((allocator<char> *)&local_401);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_428,"cp1251",&local_429);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](in_stack_fffffffffffff680,in_stack_fffffffffffff678);
  *pp_Var2 = windows_1251_valid<char_const*>;
  std::__cxx11::string::~string(local_428);
  std::allocator<char>::~allocator((allocator<char> *)&local_429);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_450,"cp1252",&local_451);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](in_stack_fffffffffffff680,in_stack_fffffffffffff678);
  *pp_Var2 = windows_1252_valid<char_const*>;
  std::__cxx11::string::~string(local_450);
  std::allocator<char>::~allocator((allocator<char> *)&local_451);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_478,"cp1253",&local_479);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](in_stack_fffffffffffff680,in_stack_fffffffffffff678);
  *pp_Var2 = windows_1253_valid<char_const*>;
  std::__cxx11::string::~string(local_478);
  std::allocator<char>::~allocator((allocator<char> *)&local_479);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4a0,"cp1255",&local_4a1);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](in_stack_fffffffffffff680,in_stack_fffffffffffff678);
  *pp_Var2 = windows_1255_valid<char_const*>;
  std::__cxx11::string::~string(local_4a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4c8,"cp1256",&local_4c9);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](in_stack_fffffffffffff680,in_stack_fffffffffffff678);
  *pp_Var2 = windows_1256_valid<char_const*>;
  std::__cxx11::string::~string(local_4c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4f0,"cp1257",&local_4f1);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](in_stack_fffffffffffff680,in_stack_fffffffffffff678);
  *pp_Var2 = windows_1257_valid<char_const*>;
  std::__cxx11::string::~string(local_4f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_518,"cp1258",&local_519);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](in_stack_fffffffffffff680,in_stack_fffffffffffff678);
  *pp_Var2 = windows_1258_valid<char_const*>;
  std::__cxx11::string::~string(local_518);
  std::allocator<char>::~allocator((allocator<char> *)&local_519);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_540,"koi8r",&local_541);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](in_stack_fffffffffffff680,in_stack_fffffffffffff678);
  *pp_Var2 = koi8_valid<char_const*>;
  std::__cxx11::string::~string(local_540);
  std::allocator<char>::~allocator((allocator<char> *)&local_541);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_568,"koi8u",&local_569);
  this_00 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
             *)std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
               ::operator[](in_stack_fffffffffffff680,in_stack_fffffffffffff678);
  *(code **)&(this_00->_M_t)._M_impl = koi8_valid<char_const*>;
  std::__cxx11::string::~string(local_568);
  std::allocator<char>::~allocator((allocator<char> *)&local_569);
  __k = (key_type *)local_591;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_591 + 1),"utf8",(allocator *)__k);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](this_00,__k);
  *pp_Var2 = utf8_valid<char_const*>;
  std::__cxx11::string::~string((string *)(local_591 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_591);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5b8,"ascii",&local_5b9);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](this_00,__k);
  *pp_Var2 = ascii_valid<char_const*>;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5e0,"usascii",&local_5e1);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](this_00,__k);
  *pp_Var2 = ascii_valid<char_const*>;
  std::__cxx11::string::~string(local_5e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5e1);
  std::__cxx11::string::~string(local_5b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5b9);
  return;
}

Assistant:

validators_set() 
		{

			encoding_tester_type iso_tester=&iso_8859_1_2_4_5_9_10_13_14_15_16_valid<char const *>;

			
			predefined_["latin1"]=iso_tester;
			
			predefined_["iso88591"]=iso_tester;
			predefined_["iso88592"]=iso_tester;
			predefined_["iso88594"]=iso_tester;
			predefined_["iso88595"]=iso_tester;
			predefined_["iso88599"]=iso_tester;
			predefined_["iso885910"]=iso_tester;
			predefined_["iso885913"]=iso_tester;
			predefined_["iso885914"]=iso_tester;
			predefined_["iso885915"]=iso_tester;
			predefined_["iso885916"]=iso_tester;

			predefined_["iso88593"]=&iso_8859_3_valid<char const *>;
			predefined_["iso88596"]=&iso_8859_6_valid<char const *>;
			predefined_["iso88597"]=&iso_8859_7_valid<char const *>;
			predefined_["iso88598"]=&iso_8859_8_valid<char const *>;
			predefined_["iso885911"]=&iso_8859_11_valid<char const *>;

			predefined_["windows1250"]=&windows_1250_valid<char const *>;
			predefined_["windows1251"]=&windows_1251_valid<char const *>;
			predefined_["windows1252"]=&windows_1252_valid<char const *>;
			predefined_["windows1253"]=&windows_1253_valid<char const *>;
			predefined_["windows1255"]=&windows_1255_valid<char const *>;
			predefined_["windows1256"]=&windows_1256_valid<char const *>;
			predefined_["windows1257"]=&windows_1257_valid<char const *>;
			predefined_["windows1258"]=&windows_1258_valid<char const *>;

			predefined_["cp1250"]=&windows_1250_valid<char const *>;
			predefined_["cp1251"]=&windows_1251_valid<char const *>;
			predefined_["cp1252"]=&windows_1252_valid<char const *>;
			predefined_["cp1253"]=&windows_1253_valid<char const *>;
			predefined_["cp1255"]=&windows_1255_valid<char const *>;
			predefined_["cp1256"]=&windows_1256_valid<char const *>;
			predefined_["cp1257"]=&windows_1257_valid<char const *>;
			predefined_["cp1258"]=&windows_1258_valid<char const *>;

			predefined_["koi8r"]=&koi8_valid<char const *>;
			predefined_["koi8u"]=&koi8_valid<char const *>;
			
			predefined_["utf8"]=&utf8_valid<char const *>;
			predefined_["usascii"]=predefined_["ascii"]=&ascii_valid<char const *>;
		}